

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

MODE ON_Texture::ModeFromUnsigned(uint mode_as_unsigned)

{
  if (3 < mode_as_unsigned) {
    mode_as_unsigned = no_texture_mode;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x989,"","Invalid mode_as_unsigned value.");
  }
  return mode_as_unsigned;
}

Assistant:

ON_Texture::MODE ON_Texture::ModeFromUnsigned( unsigned int mode_as_unsigned )
{
  switch(mode_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::no_texture_mode);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::modulate_texture);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::decal_texture);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::blend_texture);
  }

  ON_ERROR("Invalid mode_as_unsigned value.");
  return ON_Texture::MODE::no_texture_mode;
}